

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmp_ftn_entry.h
# Opt level: O1

void omp_display_affinity(char *format,size_t size)

{
  int gtid;
  ConvertedString cformat;
  ConvertedString local_30;
  
  if (__kmp_init_middle == 0) {
    __kmp_middle_initialize();
  }
  gtid = __kmp_get_global_thread_id();
  ConvertedString::ConvertedString(&local_30,format,size);
  __kmp_aux_display_affinity(gtid,local_30.buf);
  ___kmp_thread_free(local_30.th,local_30.buf);
  return;
}

Assistant:

void FTN_STDCALL FTN_DISPLAY_AFFINITY(char const *format, size_t size) {
#ifdef KMP_STUB
  return;
#else
  int gtid;
  if (!TCR_4(__kmp_init_middle)) {
    __kmp_middle_initialize();
  }
  gtid = __kmp_get_gtid();
  ConvertedString cformat(format, size);
  __kmp_aux_display_affinity(gtid, cformat.get());
#endif
}